

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Package
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  char *__s;
  undefined8 __s_00;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  string *psVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *local_2c8;
  string *local_2c0;
  allocator<char> local_2b1;
  string local_2b0;
  cmValue local_290;
  cmValue noPackageAll;
  allocator<char> local_279;
  value_type local_278;
  allocator<char> local_251;
  value_type local_250;
  allocator<char> local_229;
  value_type local_228;
  allocator<char> local_201;
  value_type local_200;
  undefined1 local_1e0 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  char *cmakeCfgIntDir;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  const_iterator local_d0;
  char **target;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string configFile;
  value_type *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  configFile.field_2._8_8_ =
       std::
       vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
       ::operator[](&this->Makefiles,0);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                      configFile.field_2._8_8_);
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
  cmAlphaNum::cmAlphaNum(&local_70,psVar4);
  cmAlphaNum::cmAlphaNum(&local_a0,"/CPackConfig.cmake");
  cmStrCat<>((string *)local_40,&local_70,&local_a0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_40);
  if (bVar1) {
    __begin1 = (const_iterator)&AddGlobalTarget_Package::reservedTargets;
    __end1 = std::initializer_list<const_char_*>::begin(&AddGlobalTarget_Package::reservedTargets);
    target = std::initializer_list<const_char_*>::end(&AddGlobalTarget_Package::reservedTargets);
    for (; __end1 != target; __end1 = __end1 + 1) {
      local_d0 = __end1;
      __s = *__end1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,__s,&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"when CPack packaging is enabled",
                 (allocator<char> *)((long)&cmakeCfgIntDir + 7));
      bVar1 = CheckCMP0037(this,&local_f0,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmakeCfgIntDir + 7));
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        __range1._0_4_ = 1;
        goto LAB_00299de8;
      }
    }
    gti._152_4_ = (*this->_vptr_cmGlobalGenerator[0x15])();
    gti._156_4_ = extraout_var;
    GlobalTargetInfo::GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x1f])();
    std::__cxx11::string::operator=
              ((string *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char *)CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::operator=
              ((string *)(gti.Name.field_2._M_local_buf + 8),"Run CPack packaging tool...");
    gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
    pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                       ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                        configFile.field_2._8_8_);
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar3);
    std::__cxx11::string::operator=
              ((string *)
               &gti.Depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar4);
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_1e0);
    psVar4 = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1e0,psVar4);
    bVar1 = cmNonempty((char *)gti._152_8_);
    if ((bVar1) && (*(char *)gti._152_8_ != '.')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"-C",&local_201);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      __s_00 = gti._152_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,(char *)__s_00,&local_229);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1e0,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"--config",&local_251);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1e0,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"./CPackConfig.cmake",&local_279);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1e0,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               ((long)&gti.Message.field_2 + 8),(value_type *)local_1e0);
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x1d])();
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                          configFile.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY",&local_2b1);
      local_290 = cmMakefile::GetDefinition(pcVar3,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      local_2c0 = local_290.Value;
      bVar1 = cmIsOff(local_290);
      if (bVar1) {
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x19])();
        local_2c8 = (char *)CONCAT44(extraout_var_03,iVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c8);
      }
    }
    else {
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1d])();
      noPackageAll.Value = (string *)CONCAT44(extraout_var_02,iVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &gti.CommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&noPackageAll);
    }
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::push_back(targets,(value_type *)
                        &singleLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_1e0);
    GlobalTargetInfo::~GlobalTargetInfo
              ((GlobalTargetInfo *)
               &singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __range1._0_4_ = 0;
  }
  else {
    __range1._0_4_ = 1;
  }
LAB_00299de8:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Package(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package", "PACKAGE" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CPack packaging is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetPackageTargetName();
  gti.Message = "Run CPack packaging tool...";
  gti.UsesTerminal = true;
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  }
  singleLine.push_back("--config");
  singleLine.push_back("./CPackConfig.cmake");
  gti.CommandLines.push_back(std::move(singleLine));
  if (this->GetPreinstallTargetName()) {
    gti.Depends.emplace_back(this->GetPreinstallTargetName());
  } else {
    cmValue noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if (cmIsOff(noPackageAll)) {
      gti.Depends.emplace_back(this->GetAllTargetName());
    }
  }
  targets.push_back(std::move(gti));
}